

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_decompress.c
# Opt level: O2

int infile_format(char *fname)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  size_t sVar3;
  int iVar4;
  char *pcVar5;
  uchar buf [12];
  
  __stream = fopen(fname,"rb");
  if (__stream == (FILE *)0x0) {
    iVar1 = -2;
  }
  else {
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    sVar3 = fread(buf,1,0xc,__stream);
    fclose(__stream);
    iVar1 = -1;
    if (sVar3 == 0xc) {
      iVar1 = get_file_format(fname);
      if (iVar1 == 2) {
        iVar1 = 2;
      }
      else {
        iVar2 = bcmp(buf,"",0xc);
        iVar4 = 1;
        pcVar5 = ".jp2 or .jph";
        if ((iVar2 != 0) && (buf._0_4_ != 0xa870a0d)) {
          if (buf._0_4_ != 0x51ff4fff) {
            return -1;
          }
          iVar4 = 0;
          pcVar5 = ".j2k or .jpc or .j2c or .jhc";
        }
        if (iVar4 != iVar1) {
          sVar3 = strlen(fname);
          fputs("\n===========================================\n",_stderr);
          fprintf(_stderr,"The extension of this file is incorrect.\nFOUND %s. SHOULD BE %s\n",
                  fname + (sVar3 - 4),pcVar5);
          fputs("===========================================\n",_stderr);
          iVar1 = iVar4;
        }
      }
    }
  }
  return iVar1;
}

Assistant:

static int infile_format(const char *fname)
{
    FILE *reader;
    const char *s, *magic_s;
    int ext_format, magic_format;
    unsigned char buf[12];
    OPJ_SIZE_T l_nb_read;

    reader = fopen(fname, "rb");

    if (reader == NULL) {
        return -2;
    }

    memset(buf, 0, 12);
    l_nb_read = fread(buf, 1, 12, reader);
    fclose(reader);
    if (l_nb_read != 12) {
        return -1;
    }



    ext_format = get_file_format(fname);

    if (ext_format == JPT_CFMT) {
        return JPT_CFMT;
    }

    if (memcmp(buf, JP2_RFC3745_MAGIC, 12) == 0 || memcmp(buf, JP2_MAGIC, 4) == 0) {
        magic_format = JP2_CFMT;
        magic_s = ".jp2 or .jph";
    } else if (memcmp(buf, J2K_CODESTREAM_MAGIC, 4) == 0) {
        magic_format = J2K_CFMT;
        magic_s = ".j2k or .jpc or .j2c or .jhc";
    } else {
        return -1;
    }

    if (magic_format == ext_format) {
        return ext_format;
    }

    s = fname + strlen(fname) - 4;

    fputs("\n===========================================\n", stderr);
    fprintf(stderr, "The extension of this file is incorrect.\n"
            "FOUND %s. SHOULD BE %s\n", s, magic_s);
    fputs("===========================================\n", stderr);

    return magic_format;
}